

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::Add(Registry *this,BorderAgent *aValue)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 *puVar4;
  char *pcVar5;
  Status SVar6;
  char cVar7;
  char cVar8;
  Domain dom;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  routers;
  Network nwk;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  domains;
  DomainId domainId;
  string local_1a0 [136];
  uint64_t local_118;
  uint32_t local_38;
  
  Domain::Domain(&dom);
  if ((aValue->mPresentFlags & 0x1000) != 0) {
    std::__cxx11::string::_M_assign((string *)&dom.mName);
    domains.
    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    domains.
    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    domains.
    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x15])(this->mStorage,&dom);
    SVar6 = kError;
    if (((byte)iVar3 < 2) &&
       ((ulong)(((long)domains.
                       super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)domains.
                      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28) < 2)) {
      if ((byte)iVar3 == 1) {
        DomainId::DomainId(&domainId,0xffffffff);
        iVar3 = (*this->mStorage->_vptr_PersistentStorage[5])(this->mStorage,&dom,&domainId);
        cVar7 = (char)iVar3;
        SVar6 = (cVar7 != '\0') << 2;
        if (cVar7 == '\x01') {
          SVar6 = kNotFound;
        }
        bVar2 = cVar7 == '\0';
        if (bVar2) {
          dom.mId = domainId;
        }
      }
      else {
        Domain::operator=(&dom,domains.
                               super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    std::
    vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ::~vector(&domains);
    if (!bVar2) goto LAB_00211980;
  }
  Network::Network(&nwk);
  if ((aValue->mPresentFlags & 0x30) != 0) {
    if ((aValue->mPresentFlags & 0x20) == 0) {
      std::__cxx11::string::_M_assign((string *)&nwk.mName);
    }
    else {
      nwk.mXpan = aValue->mExtendedPanId;
    }
    domains.
    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    domains.
    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    domains.
    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x16])(this->mStorage,&nwk);
    cVar1 = (char)iVar3;
    cVar7 = (cVar1 != '\0') << 2;
    if (cVar1 == '\x01') {
      cVar7 = '\x01';
    }
    if ((cVar7 == '\x04') ||
       (1 < (ulong)(((long)domains.
                           super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)domains.
                          super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x60))) {
LAB_00211a8b:
      pcVar5 = (char *)__cxa_allocate_exception(1);
      *pcVar5 = cVar7;
      __cxa_throw(pcVar5,&Status::typeinfo,0);
    }
    if (cVar1 == '\x01') {
      NetworkId::NetworkId((NetworkId *)&domainId,0xffffffff);
      if ((~aValue->mPresentFlags & 0x30) == 0) {
        std::__cxx11::string::_M_assign((string *)&nwk.mName);
      }
      nwk.mDomainId = dom.mId;
      nwk.mXpan = aValue->mExtendedPanId;
      nwk.mCcm = (int)(((uint)aValue->mState & 7) == 4);
      iVar3 = (*this->mStorage->_vptr_PersistentStorage[6])(this->mStorage,&nwk,&domainId);
      if ((char)iVar3 != '\0') {
        pcVar5 = (char *)__cxa_allocate_exception(1);
        *pcVar5 = ((char)iVar3 != '\x01') * '\x03' + '\x01';
        __cxa_throw(pcVar5,&Status::typeinfo,0);
      }
      nwk.mId.mId = domainId.mId;
    }
    else {
      Network::operator=(&nwk,(Network *)
                              domains.
                              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      if ((nwk.mDomainId.mId != dom.mId.mId) ||
         (bVar2 = std::operator!=(&nwk.mName,&aValue->mNetworkName), bVar2)) {
        nwk.mDomainId = dom.mId;
        std::__cxx11::string::_M_assign((string *)&nwk.mName);
        iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x12])(this->mStorage,&nwk);
        if ((char)iVar3 != '\0') {
          cVar7 = ((char)iVar3 != '\x01') * '\x03' + '\x01';
          goto LAB_00211a8b;
        }
      }
    }
    std::
    vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               *)&domains);
  }
  BorderRouterId::BorderRouterId((BorderRouterId *)&domainId,0xffffffff);
  BorderRouter::BorderRouter((BorderRouter *)&domains,(BorderRouterId *)&domainId,&nwk.mId,aValue);
  if (domains.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ == -1) {
    puVar4 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar4 = 4;
    __cxa_throw(puVar4,&Status::typeinfo,0);
  }
  BorderRouter::BorderRouter((BorderRouter *)&domainId);
  std::__cxx11::string::_M_assign(local_1a0);
  local_118 = aValue->mExtendedPanId;
  local_38 = 0x21;
  routers.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  routers.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  routers.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x17])();
  cVar1 = (char)iVar3;
  cVar8 = (cVar1 != '\0') << 2;
  cVar7 = cVar8;
  if (cVar1 == '\x01') {
    cVar7 = '\x01';
  }
  if (cVar7 == '\x01') {
LAB_0021191b:
    iVar3 = (*this->mStorage->_vptr_PersistentStorage[7])
                      (this->mStorage,&domains,
                       &domains.
                        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    cVar7 = (char)iVar3;
LAB_00211935:
    if (cVar7 == '\x01') {
      cVar8 = '\x01';
LAB_00211a2f:
      pcVar5 = (char *)__cxa_allocate_exception(1);
      *pcVar5 = cVar8;
      __cxa_throw(pcVar5,&Status::typeinfo,0);
    }
    cVar8 = (cVar7 != '\0') << 2;
    if (cVar7 != '\0') goto LAB_00211a2f;
  }
  else {
    if (cVar7 != '\0') goto LAB_00211a2f;
    if ((long)routers.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)routers.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x188) {
      domains.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(domains.
                             super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             ((routers.
                               super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                               ._M_impl.super__Vector_impl_data._M_start)->mId).mId);
      iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x13])();
      cVar7 = (char)iVar3;
      goto LAB_00211935;
    }
    if (cVar1 == '\x01') goto LAB_0021191b;
  }
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector(&routers);
  BorderRouter::~BorderRouter((BorderRouter *)&domainId);
  BorderRouter::~BorderRouter((BorderRouter *)&domains);
  SVar6 = kSuccess;
  Network::~Network(&nwk);
LAB_00211980:
  std::__cxx11::string::~string((string *)&dom.mName);
  return SVar6;
}

Assistant:

Registry::Status Registry::Add(BorderAgent const &aValue)
{
    Domain           dom{};
    bool             domainCreated = false;
    Registry::Status status;

    if ((aValue.mPresentFlags & BorderAgent::kDomainNameBit) != 0)
    {
        dom.mName = aValue.mDomainName;
        std::vector<Domain> domains;
        status = MapStatus(mStorage->Lookup(dom, domains));
        if (status == Registry::Status::kError || domains.size() > 1)
        {
            return Registry::Status::kError;
        }

        if (status == Registry::Status::kNotFound)
        {
            DomainId domainId{EMPTY_ID};
            status = MapStatus(mStorage->Add(dom, domainId));
            if (status != Registry::Status::kSuccess)
            {
                return status;
            }
            dom.mId       = domainId;
            domainCreated = true;
        }
        else
        {
            dom = domains[0];
        }
    }

    Network nwk{};
    bool    networkCreated = false;

    try
    {
        if ((aValue.mPresentFlags & BorderAgent::kNetworkNameBit) != 0 ||
            (aValue.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0)
        {
            // If xpan present lookup with it only
            // Discussed: is different aName an error?
            // Decided: update network aName in the network entity
            if ((aValue.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0)
            {
                nwk.mXpan = aValue.mExtendedPanId;
            }
            else
            {
                nwk.mName = aValue.mNetworkName;
            }

            std::vector<Network> nwks;
            status = MapStatus(mStorage->Lookup(nwk, nwks));
            if (status == Registry::Status::kError || nwks.size() > 1)
            {
                throw status;
            }

            if (status == Registry::Status::kNotFound)
            {
                NetworkId networkId{EMPTY_ID};
                // It is possible we found the network by xpan
                if ((aValue.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0 &&
                    (aValue.mPresentFlags & BorderAgent::kNetworkNameBit) != 0)
                {
                    nwk.mName = aValue.mNetworkName;
                }
                nwk.mDomainId = dom.mId;
                nwk.mXpan     = aValue.mExtendedPanId;

                // Provisionally set network's CCM flag considering
                // advertised Connection Mode.
                //
                // Please note that actually see if CCM enabled or not
                // is possible only by respective security policy flag
                // from Active Operational Dataset. Later, if and when
                // successfully petitioned to the network, the flag
                // will be updated by real network dataset.
                nwk.mCcm = ((aValue.mState.mConnectionMode == 4) ? 1 : 0);
                status   = MapStatus(mStorage->Add(nwk, networkId));
                if (status != Registry::Status::kSuccess)
                {
                    throw status;
                }
                nwk.mId        = networkId;
                networkCreated = true;
            }
            else
            {
                nwk = nwks[0];
                if (nwk.mDomainId.mId != dom.mId.mId || nwk.mName != aValue.mNetworkName)
                {
                    nwk.mDomainId.mId = dom.mId.mId;
                    nwk.mName         = aValue.mNetworkName;
                    status            = MapStatus(mStorage->Update(nwk));
                    if (status != Registry::Status::kSuccess)
                    {
                        throw status;
                    }
                }
            }
        }

        BorderRouter br{BorderRouterId{EMPTY_ID}, nwk.mId, aValue};
        try
        {
            if (br.mNetworkId.mId == EMPTY_ID)
            {
                throw Registry::Status::kError;
            }

            // Lookup BorderRouter by address and port to decide to add() or update()
            // Assuming address and port are set (it should be so).
            BorderRouter lookupBr{};
            lookupBr.mAgent.mAddr          = aValue.mAddr;
            lookupBr.mAgent.mExtendedPanId = aValue.mExtendedPanId;
            lookupBr.mAgent.mPresentFlags  = BorderAgent::kAddrBit | BorderAgent::kExtendedPanIdBit;
            std::vector<BorderRouter> routers;
            status = MapStatus(mStorage->Lookup(lookupBr, routers));
            if (status == Registry::Status::kSuccess && routers.size() == 1)
            {
                br.mId.mId = routers[0].mId.mId;
                status     = MapStatus(mStorage->Update(br));
            }
            else if (status == Registry::Status::kNotFound)
            {
                status = MapStatus(mStorage->Add(br, br.mId));
            }

            if (status != Registry::Status::kSuccess)
            {
                throw status;
            }
        } catch (Registry::Status thrownStatus)
        {
            if (networkCreated)
            {
                MapStatus(mStorage->Del(nwk.mId));
            }
            throw;
        }
    } catch (Registry::Status thrownStatus)
    {
        if (domainCreated)
        {
            MapStatus(mStorage->Del(dom.mId));
        }
        status = thrownStatus;
    }
    return status;
}